

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O1

size_t revealSeeds(tree_t *tree,uint16_t *hideList,size_t hideListSize,uint8_t *output,
                  size_t outputSize,picnic_instance_t *params)

{
  uint *__ptr;
  ulong uVar1;
  uint8_t *__dest;
  size_t sVar2;
  size_t sVar3;
  size_t revealedSize;
  size_t local_38;
  
  local_38 = 0;
  __ptr = getRevealedNodes(tree,hideList,hideListSize,&local_38);
  sVar2 = local_38;
  uVar1 = params->seed_size * local_38;
  if (uVar1 < outputSize || uVar1 - outputSize == 0) {
    __dest = output;
    if (local_38 != 0) {
      sVar3 = 0;
      do {
        memcpy(__dest,tree->nodes + __ptr[sVar3] * (uint)params->seed_size,(ulong)params->seed_size)
        ;
        __dest = __dest + params->seed_size;
        sVar3 = sVar3 + 1;
      } while (sVar2 != sVar3);
    }
    free(__ptr);
    sVar2 = (long)__dest - (long)output;
  }
  else {
    free(__ptr);
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t revealSeeds(tree_t* tree, uint16_t* hideList, size_t hideListSize, uint8_t* output,
                   size_t outputSize, const picnic_instance_t* params) {
  uint8_t* outputBase = output;
  size_t revealedSize = 0;

  unsigned int* revealed = getRevealedNodes(tree, hideList, hideListSize, &revealedSize);
  if (outputSize < params->seed_size * revealedSize) {
    assert(!"Insufficient sized buffer provided to revealSeeds");
    free(revealed);
    return 0;
  }

  for (size_t i = 0; i < revealedSize; i++) {
    memcpy(output, &tree->nodes[revealed[i] * params->seed_size], params->seed_size);
    output += params->seed_size;
  }

  free(revealed);
  return output - outputBase;
}